

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaFanout.c
# Opt level: O0

void Gia_ManStaticFanoutStop(Gia_Man_t *p)

{
  Gia_Man_t *p_local;
  
  Vec_IntFreeP(&p->vFanoutNums);
  Vec_IntFreeP(&p->vFanout);
  return;
}

Assistant:

void Gia_ManStaticFanoutStop( Gia_Man_t * p )
{
    Vec_IntFreeP( &p->vFanoutNums );
    Vec_IntFreeP( &p->vFanout );
}